

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdi::ControlContainer::~ControlContainer(ControlContainer *this)

{
  QWidget *pQVar1;
  QObject *in_RDI;
  ControlContainer *in_stack_00000008;
  QMenuBar *in_stack_00000038;
  QWidget *in_stack_ffffffffffffffd8;
  QPointer<QWidget> *in_stack_ffffffffffffffe0;
  
  *(undefined ***)in_RDI = &PTR_metaObject_00d17230;
  removeButtonsFromMenuBar(in_stack_00000008,in_stack_00000038);
  pQVar1 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x62bdcc);
  if (pQVar1 != (QWidget *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x20))();
  }
  QPointer<QWidget>::operator=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pQVar1 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x62be02);
  if (pQVar1 != (QWidget *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x20))();
  }
  QPointer<QWidget>::operator=((QPointer<QWidget> *)pQVar1,in_stack_ffffffffffffffd8);
  QPointer<QMdiSubWindow>::~QPointer((QPointer<QMdiSubWindow> *)0x62be38);
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x62be46);
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x62be54);
  QPointer<QMenuBar>::~QPointer((QPointer<QMenuBar> *)0x62be62);
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x62be70);
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x62be7e);
  QObject::~QObject(in_RDI);
  return;
}

Assistant:

ControlContainer::~ControlContainer()
{
#if QT_CONFIG(menubar)
    removeButtonsFromMenuBar();
#endif
    delete m_menuLabel;
    m_menuLabel = nullptr;
    delete m_controllerWidget;
    m_controllerWidget = nullptr;
}